

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Type.cpp
# Opt level: O2

Type * __thiscall soul::Type::getArrayElementType(Type *__return_storage_ptr__,Type *this)

{
  if (this->category == array) {
    __return_storage_ptr__->category = this->arrayElementCategory;
    *(undefined8 *)&__return_storage_ptr__->arrayElementCategory = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->boundingSize + 1) = 0;
    (__return_storage_ptr__->structure).object = (Structure *)0x0;
    (__return_storage_ptr__->primitiveType).type = (this->primitiveType).type;
    __return_storage_ptr__->boundingSize = this->arrayElementBoundingSize;
    RefCountedPtr<soul::Structure>::operator=(&__return_storage_ptr__->structure,&this->structure);
    return __return_storage_ptr__;
  }
  throwInternalCompilerError("isArray()","getArrayElementType",300);
}

Assistant:

bool Type::isArray() const                { return category == Category::array; }